

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void ws_stop(void *arg)

{
  int iVar1;
  nni_mtx *mtx;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  ws_close((nni_ws *)arg,1000);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  nni_aio_wait((nni_aio *)((long)arg + 0x488));
  nni_aio_stop((nni_aio *)((long)arg + 0x2c0));
  nni_aio_stop((nni_aio *)((long)arg + 0xf8));
  nni_aio_stop((nni_aio *)((long)arg + 0x488));
  nni_aio_stop((nni_aio *)((long)arg + 0x650));
  iVar1 = nni_list_node_active((nni_list_node *)((long)arg + 0x38));
  if ((iVar1 != 0) && (*(long *)((long)arg + 0xa10) != 0)) {
    mtx = (nni_mtx *)(*(long *)((long)arg + 0xa10) + 0x58);
    nni_mtx_lock(mtx);
    nni_list_node_remove((nni_list_node *)((long)arg + 0x38));
    *(undefined8 *)((long)arg + 0xa10) = 0;
    nni_mtx_unlock(mtx);
    return;
  }
  return;
}

Assistant:

static void
ws_stop(void *arg)
{
	nni_ws *ws = arg;
	ws_close_error(ws, WS_CLOSE_NORMAL_CLOSE);

	// Give a chance for the close frame to drain.
	nni_aio_wait(&ws->closeaio);

	nni_aio_stop(&ws->rxaio);
	nni_aio_stop(&ws->txaio);
	nni_aio_stop(&ws->closeaio);
	nni_aio_stop(&ws->httpaio);

	if (nni_list_node_active(&ws->node)) {
		nni_ws_dialer *d;

		if ((d = ws->dialer) != NULL) {
			nni_mtx_lock(&d->mtx);
			nni_list_node_remove(&ws->node);
			ws->dialer = NULL;
			nni_mtx_unlock(&d->mtx);
		}
	}
}